

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.c
# Opt level: O2

char * getActionName(efsw_action action)

{
  if (action - EFSW_ADD < 4) {
    return &DAT_00112008 + *(int *)(&DAT_00112008 + (ulong)(action - EFSW_ADD) * 4);
  }
  return "Bad Action";
}

Assistant:

const char * getActionName( enum efsw_action action ) {
	switch ( action ) {
		case EFSW_ADD:
			return "Add";
		case EFSW_MODIFIED:
			return "Modified";
		case EFSW_DELETE:
			return "Delete";
		case EFSW_MOVED:
			return "Moved";
		default:
			return "Bad Action";
	}
}